

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetTypedMedianAbsoluteDeviationAggregateFunction<float,float,float>
          (LogicalType *input_type,LogicalType *target_type)

{
  LogicalType *in_RDX;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *fun;
  AggregateFunction *pAVar1;
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = 0;
  pAVar1 = in_RDI;
  duckdb::LogicalType::LogicalType(local_38,in_RSI);
  duckdb::LogicalType::LogicalType(local_50,in_RDX);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,float,duckdb::MedianAbsoluteDeviationOperation<float>,(duckdb::AggregateDestructorType)1>
            (in_RDX,(LogicalType *)CONCAT17(uVar2,in_stack_ffffffffffffffe0));
  duckdb::LogicalType::~LogicalType(local_50);
  duckdb::LogicalType::~LogicalType(local_38);
  pAVar1->bind = BindMAD;
  pAVar1->order_dependent = NOT_ORDER_DEPENDENT;
  pAVar1->window =
       MedianAbsoluteDeviationOperation<float>::
       Window<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,float>;
  pAVar1->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float>;
  return in_RDI;
}

Assistant:

AggregateFunction GetTypedMedianAbsoluteDeviationAggregateFunction(const LogicalType &input_type,
                                                                   const LogicalType &target_type) {
	using STATE = QuantileState<INPUT_TYPE, QuantileStandardType>;
	using OP = MedianAbsoluteDeviationOperation<MEDIAN_TYPE>;
	auto fun = AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, TARGET_TYPE, OP,
	                                                       AggregateDestructorType::LEGACY>(input_type, target_type);
	fun.bind = BindMAD;
	fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
#ifndef DUCKDB_SMALLER_BINARY
	fun.window = OP::template Window<STATE, INPUT_TYPE, TARGET_TYPE>;
	fun.window_init = OP::template WindowInit<STATE, INPUT_TYPE>;
#endif
	return fun;
}